

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrApplicationInfo *value)

{
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *pvVar1;
  string *psVar2;
  size_t sVar3;
  allocator local_119;
  string local_118 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f8;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  allocator local_61;
  string local_60 [36];
  XrResult local_3c;
  XrApplicationInfo *pXStack_38;
  XrResult xr_result;
  XrApplicationInfo *value_local;
  bool check_pnext_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *pvStack_28;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  local_3c = XR_SUCCESS;
  if (check_members) {
    pXStack_38 = value;
    value_local._6_1_ = check_pnext;
    value_local._7_1_ = check_members;
    pvStack_28 = objects_info;
    objects_info_local =
         (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
         command_name;
    command_name_local = (string *)instance_info;
    sVar3 = strlen(value->applicationName);
    psVar2 = command_name_local;
    if (sVar3 < 0x81) {
      sVar3 = strlen(pXStack_38->engineName);
      psVar2 = command_name_local;
      if (sVar3 < 0x81) {
        instance_info_local._4_4_ = local_3c;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_d8,"VUID-XrApplicationInfo-engineName-parameter",&local_d9);
        pvVar1 = objects_info_local;
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_f8,pvStack_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_118,"Structure XrApplicationInfo member engineName length is too long.",
                   &local_119);
        CoreValidLogMessage((GenValidUsageXrInstanceInfo *)psVar2,(string *)local_d8,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)pvVar1,&local_f8,
                            (string *)local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_f8);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"VUID-XrApplicationInfo-applicationName-parameter",&local_61);
      pvVar1 = objects_info_local;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_90,pvStack_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,"Structure XrApplicationInfo member applicationName length is too long.",
                 &local_b1);
      CoreValidLogMessage((GenValidUsageXrInstanceInfo *)psVar2,(string *)local_60,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)pvVar1,&local_90,
                          (string *)local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_90);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrApplicationInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_APPLICATION_NAME_SIZE < std::strlen(value->applicationName)) {
        CoreValidLogMessage(instance_info, "VUID-XrApplicationInfo-applicationName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrApplicationInfo member applicationName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (XR_MAX_ENGINE_NAME_SIZE < std::strlen(value->engineName)) {
        CoreValidLogMessage(instance_info, "VUID-XrApplicationInfo-engineName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrApplicationInfo member engineName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}